

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void Service_Read_single(UA_Server *server,UA_Session *session,UA_TimestampsToReturn timestamps,
                        UA_ReadValueId *id,UA_DataValue *v)

{
  int iVar1;
  UA_Byte *pUVar2;
  void *pvVar3;
  long lVar4;
  uint uVar5;
  UA_Boolean UVar6;
  byte bVar7;
  UA_StatusCode UVar8;
  UA_Server *server_00;
  UA_DateTime UVar9;
  UA_DataType *pUVar10;
  uint uVar11;
  UA_DataValue *v_00;
  
  v_00 = v;
  if (((id->dataEncoding).name.length != 0) &&
     (UVar6 = UA_String_equal(&binEncoding,&(id->dataEncoding).name), !UVar6)) {
    *(byte *)v = *(byte *)v | 2;
    v->status = 0x80390000;
    return;
  }
  if (((id->indexRange).length != 0) && (id->attributeId != 0xd)) {
    *(byte *)v = *(byte *)v | 2;
    v->status = 0x80370000;
    return;
  }
  server_00 = (UA_Server *)UA_NodeStore_get(server->nodestore,&id->nodeId);
  if (server_00 == (UA_Server *)0x0) {
    *(byte *)v = *(byte *)v | 2;
    v->status = 0x80340000;
    return;
  }
  UVar8 = 0x80350000;
  switch(id->attributeId) {
  case 1:
    goto switchD_0011c3bd_caseD_1;
  case 2:
    server_00 = (UA_Server *)&server_00->secureChannelManager;
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    pUVar10 = (UA_DataType *)0x13bf90;
    break;
  case 3:
    server_00 = (UA_Server *)&(server_00->secureChannelManager).currentChannelCount;
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    pUVar10 = (UA_DataType *)0x13b720;
    break;
  case 4:
    server_00 = (UA_Server *)&server_00->sessionManager;
    goto LAB_0011c516;
  case 5:
    server_00 = (UA_Server *)&server_00->namespacesSize;
    goto LAB_0011c516;
  case 6:
    server_00 = (UA_Server *)&server_00->config;
    goto LAB_0011c60c;
  case 7:
    server_00 = (UA_Server *)&(server_00->config).field_0x4;
LAB_0011c60c:
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    pUVar10 = (UA_DataType *)0x13b4b0;
    break;
  case 8:
    iVar1 = *(int *)&(server_00->secureChannelManager).channels.lh_first;
    uVar5 = iVar1 - 8U >> 3;
    uVar11 = iVar1 << 0x1d | uVar5;
    if ((7 < uVar11) || ((0x8bU >> (uVar5 & 0x1f) & 1) == 0)) goto switchD_0011c3bd_default;
    lVar4 = *(long *)(&DAT_00129898 + (ulong)uVar11 * 8);
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    (v->value).type = UA_TYPES;
    (v->value).data = (void *)((long)&server_00->startTime + lVar4);
    goto LAB_0011c693;
  case 9:
    bVar7 = *(byte *)&(server_00->secureChannelManager).channels.lh_first & 0x20;
    goto joined_r0x0011c5d1;
  case 10:
    if (((ulong)(server_00->secureChannelManager).channels.lh_first & 0x20) == 0)
    goto switchD_0011c3bd_default;
    server_00 = (UA_Server *)&(server_00->config).buildInfo.manufacturerName;
LAB_0011c516:
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    pUVar10 = (UA_DataType *)0x13b750;
    break;
  case 0xb:
    bVar7 = *(byte *)&(server_00->secureChannelManager).channels.lh_first & 0x80;
    goto joined_r0x0011c5d1;
  case 0xc:
    if (((ulong)(server_00->secureChannelManager).channels.lh_first & 0x81) == 0)
    goto switchD_0011c3bd_default;
    server_00 = (UA_Server *)&(server_00->config).buildInfo.productUri.data;
    goto LAB_0011c596;
  case 0xd:
    if ((((ulong)(server_00->secureChannelManager).channels.lh_first & 0x12) == 0) ||
       (UVar8 = readValueAttributeComplete
                          (server_00,(UA_VariableNode *)(ulong)timestamps,(int)id + 0x20,
                           (UA_String *)v,v_00), UVar8 != 0)) goto switchD_0011c3bd_default;
    goto LAB_0011c69a;
  case 0xe:
    if (((ulong)(server_00->secureChannelManager).channels.lh_first & 0x12) == 0)
    goto switchD_0011c3bd_default;
    server_00 = (UA_Server *)&(server_00->config).buildInfo.productUri.data;
    goto switchD_0011c3bd_caseD_1;
  case 0xf:
    if (((ulong)(server_00->secureChannelManager).channels.lh_first & 0x12) == 0)
    goto switchD_0011c3bd_default;
    server_00 = (UA_Server *)&(server_00->config).buildInfo.productName;
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    pUVar10 = (UA_DataType *)0x13b480;
    break;
  case 0x10:
    if (((ulong)(server_00->secureChannelManager).channels.lh_first & 0x12) != 0) {
      pUVar2 = (server_00->config).buildInfo.productName.data;
      pvVar3 = (void *)(server_00->config).buildInfo.softwareVersion.length;
      (v->value).data = (void *)0x0;
      (v->value).arrayDimensionsSize = 0;
      *(undefined8 *)&(v->value).storageType = 0;
      (v->value).arrayLength = 0;
      (v->value).arrayDimensions = (UA_UInt32 *)0x0;
      (v->value).data = pvVar3;
      (v->value).arrayLength = (size_t)pUVar2;
      (v->value).type = (UA_DataType *)0x13b4b0;
      (v->value).storageType = UA_VARIANT_DATA_NODELETE;
      *(byte *)v = *(byte *)v | 1;
      goto LAB_0011c69a;
    }
    goto switchD_0011c3bd_default;
  case 0x11:
    if (((ulong)(server_00->secureChannelManager).channels.lh_first & 2) == 0)
    goto switchD_0011c3bd_default;
    server_00 = (UA_Server *)&(server_00->config).applicationDescription.discoveryProfileUri.data;
    goto LAB_0011c596;
  case 0x12:
    if (((ulong)(server_00->secureChannelManager).channels.lh_first & 2) == 0)
    goto switchD_0011c3bd_default;
    server_00 = (UA_Server *)
                ((long)&(server_00->config).applicationDescription.discoveryProfileUri.data + 1);
LAB_0011c596:
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    pUVar10 = (UA_DataType *)0x13b3f0;
    break;
  case 0x13:
    if (((ulong)(server_00->secureChannelManager).channels.lh_first & 2) == 0)
    goto switchD_0011c3bd_default;
    server_00 = (UA_Server *)&(server_00->config).applicationDescription.discoveryUrlsSize;
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    pUVar10 = (UA_DataType *)0x13b570;
    break;
  case 0x14:
    if (((ulong)(server_00->secureChannelManager).channels.lh_first & 2) == 0)
    goto switchD_0011c3bd_default;
    server_00 = (UA_Server *)&(server_00->config).applicationDescription.discoveryUrls;
    goto LAB_0011c674;
  case 0x15:
    if (((ulong)(server_00->secureChannelManager).channels.lh_first & 4) == 0)
    goto switchD_0011c3bd_default;
    server_00 = (UA_Server *)&(server_00->config).buildInfo.productUri.data;
    goto LAB_0011c674;
  case 0x16:
    bVar7 = *(byte *)&(server_00->secureChannelManager).channels.lh_first & 4;
joined_r0x0011c5d1:
    if (bVar7 == 0) {
switchD_0011c3bd_default:
      *(byte *)v = *(byte *)v | 2;
      v->status = UVar8;
      return;
    }
    server_00 = (UA_Server *)((long)&(server_00->config).buildInfo.productUri.data + 1);
LAB_0011c674:
    (v->value).data = (void *)0x0;
    (v->value).arrayDimensionsSize = 0;
    *(undefined8 *)&(v->value).storageType = 0;
    (v->value).arrayLength = 0;
    (v->value).arrayDimensions = (UA_UInt32 *)0x0;
    pUVar10 = UA_TYPES;
    break;
  default:
    goto switchD_0011c3bd_default;
  }
LAB_0011c68b:
  (v->value).type = pUVar10;
  (v->value).data = server_00;
LAB_0011c693:
  (v->value).storageType = UA_VARIANT_DATA_NODELETE;
LAB_0011c69a:
  bVar7 = *(byte *)v | 1;
  *(byte *)v = bVar7;
  if (timestamps - UA_TIMESTAMPSTORETURN_SERVER < 2) {
    UVar9 = UA_DateTime_now();
    v->serverTimestamp = UVar9;
    bVar7 = *(byte *)v | 8;
    *(byte *)v = bVar7;
  }
  if (id->attributeId == 0xd) {
    if ((timestamps & ~UA_TIMESTAMPSTORETURN_BOTH) == UA_TIMESTAMPSTORETURN_SERVER) {
      *(byte *)v = bVar7 & 0xeb;
    }
    else if ((bVar7 & 4) == 0) {
      UVar9 = UA_DateTime_now();
      v->sourceTimestamp = UVar9;
      *(byte *)v = *(byte *)v | 4;
    }
  }
  return;
switchD_0011c3bd_caseD_1:
  (v->value).data = (void *)0x0;
  (v->value).arrayDimensionsSize = 0;
  *(undefined8 *)&(v->value).storageType = 0;
  (v->value).arrayLength = 0;
  (v->value).arrayDimensions = (UA_UInt32 *)0x0;
  pUVar10 = (UA_DataType *)0x13b690;
  goto LAB_0011c68b;
}

Assistant:

void Service_Read_single(UA_Server *server, UA_Session *session,
                         const UA_TimestampsToReturn timestamps,
                         const UA_ReadValueId *id, UA_DataValue *v) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Read the attribute %i", id->attributeId);

    /* XML encoding is not supported */
    if(id->dataEncoding.name.length > 0 &&
       !UA_String_equal(&binEncoding, &id->dataEncoding.name)) {
           v->hasStatus = true;
           v->status = UA_STATUSCODE_BADDATAENCODINGUNSUPPORTED;
           return;
    }

    /* Index range for an attribute other than value */
    if(id->indexRange.length > 0 && id->attributeId != UA_ATTRIBUTEID_VALUE) {
        v->hasStatus = true;
        v->status = UA_STATUSCODE_BADINDEXRANGENODATA;
        return;
    }

    /* Get the node */
    const UA_Node *node = UA_NodeStore_get(server->nodestore, &id->nodeId);
    if(!node) {
        v->hasStatus = true;
        v->status = UA_STATUSCODE_BADNODEIDUNKNOWN;
        return;
    }

    /* Read the attribute */
    UA_StatusCode retval = UA_STATUSCODE_GOOD;
    switch(id->attributeId) {
    case UA_ATTRIBUTEID_NODEID:
        forceVariantSetScalar(&v->value, &node->nodeId, &UA_TYPES[UA_TYPES_NODEID]);
        break;
    case UA_ATTRIBUTEID_NODECLASS:
        forceVariantSetScalar(&v->value, &node->nodeClass, &UA_TYPES[UA_TYPES_NODECLASS]);
        break;
    case UA_ATTRIBUTEID_BROWSENAME:
        forceVariantSetScalar(&v->value, &node->browseName, &UA_TYPES[UA_TYPES_QUALIFIEDNAME]);
        break;
    case UA_ATTRIBUTEID_DISPLAYNAME:
        forceVariantSetScalar(&v->value, &node->displayName, &UA_TYPES[UA_TYPES_LOCALIZEDTEXT]);
        break;
    case UA_ATTRIBUTEID_DESCRIPTION:
        forceVariantSetScalar(&v->value, &node->description, &UA_TYPES[UA_TYPES_LOCALIZEDTEXT]);
        break;
    case UA_ATTRIBUTEID_WRITEMASK:
        forceVariantSetScalar(&v->value, &node->writeMask, &UA_TYPES[UA_TYPES_UINT32]);
        break;
    case UA_ATTRIBUTEID_USERWRITEMASK:
        forceVariantSetScalar(&v->value, &node->userWriteMask, &UA_TYPES[UA_TYPES_UINT32]);
        break;
    case UA_ATTRIBUTEID_ISABSTRACT:
        retval = readIsAbstractAttribute(node, &v->value);
        break;
    case UA_ATTRIBUTEID_SYMMETRIC:
        CHECK_NODECLASS(UA_NODECLASS_REFERENCETYPE);
        forceVariantSetScalar(&v->value, &((const UA_ReferenceTypeNode*)node)->symmetric,
                              &UA_TYPES[UA_TYPES_BOOLEAN]);
        break;
    case UA_ATTRIBUTEID_INVERSENAME:
        CHECK_NODECLASS(UA_NODECLASS_REFERENCETYPE);
        forceVariantSetScalar(&v->value, &((const UA_ReferenceTypeNode*)node)->inverseName,
                              &UA_TYPES[UA_TYPES_LOCALIZEDTEXT]);
        break;
    case UA_ATTRIBUTEID_CONTAINSNOLOOPS:
        CHECK_NODECLASS(UA_NODECLASS_VIEW);
        forceVariantSetScalar(&v->value, &((const UA_ViewNode*)node)->containsNoLoops,
                              &UA_TYPES[UA_TYPES_BOOLEAN]);
        break;
    case UA_ATTRIBUTEID_EVENTNOTIFIER:
        CHECK_NODECLASS(UA_NODECLASS_VIEW | UA_NODECLASS_OBJECT);
        forceVariantSetScalar(&v->value, &((const UA_ViewNode*)node)->eventNotifier,
                              &UA_TYPES[UA_TYPES_BYTE]);
        break;
    case UA_ATTRIBUTEID_VALUE:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        retval = readValueAttributeComplete(server, (const UA_VariableNode*)node,
                                            timestamps, &id->indexRange, v);
        break;
    case UA_ATTRIBUTEID_DATATYPE:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        forceVariantSetScalar(&v->value, &((const UA_VariableTypeNode*)node)->dataType,
                              &UA_TYPES[UA_TYPES_NODEID]);
        break;
    case UA_ATTRIBUTEID_VALUERANK:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        forceVariantSetScalar(&v->value, &((const UA_VariableTypeNode*)node)->valueRank,
                              &UA_TYPES[UA_TYPES_INT32]);
        break;
    case UA_ATTRIBUTEID_ARRAYDIMENSIONS:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE | UA_NODECLASS_VARIABLETYPE);
        retval = readArrayDimensionsAttribute((const UA_VariableNode*)node, v);
        break;
    case UA_ATTRIBUTEID_ACCESSLEVEL:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE);
        forceVariantSetScalar(&v->value, &((const UA_VariableNode*)node)->accessLevel,
                              &UA_TYPES[UA_TYPES_BYTE]);
        break;
    case UA_ATTRIBUTEID_USERACCESSLEVEL:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE);
        forceVariantSetScalar(&v->value, &((const UA_VariableNode*)node)->userAccessLevel,
                              &UA_TYPES[UA_TYPES_BYTE]);
        break;
    case UA_ATTRIBUTEID_MINIMUMSAMPLINGINTERVAL:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE);
        forceVariantSetScalar(&v->value, &((const UA_VariableNode*)node)->minimumSamplingInterval,
                              &UA_TYPES[UA_TYPES_DOUBLE]);
        break;
    case UA_ATTRIBUTEID_HISTORIZING:
        CHECK_NODECLASS(UA_NODECLASS_VARIABLE);
        forceVariantSetScalar(&v->value, &((const UA_VariableNode*)node)->historizing,
                              &UA_TYPES[UA_TYPES_BOOLEAN]);
        break;
    case UA_ATTRIBUTEID_EXECUTABLE:
        CHECK_NODECLASS(UA_NODECLASS_METHOD);
        forceVariantSetScalar(&v->value, &((const UA_MethodNode*)node)->executable,
                              &UA_TYPES[UA_TYPES_BOOLEAN]);
        break;
    case UA_ATTRIBUTEID_USEREXECUTABLE:
        CHECK_NODECLASS(UA_NODECLASS_METHOD);
        forceVariantSetScalar(&v->value, &((const UA_MethodNode*)node)->userExecutable,
                              &UA_TYPES[UA_TYPES_BOOLEAN]);
        break;
    default:
        retval = UA_STATUSCODE_BADATTRIBUTEIDINVALID;
    }

    /* Return error code when reading has failed */
    if(retval != UA_STATUSCODE_GOOD) {
        v->hasStatus = true;
        v->status = retval;
        return;
    }

    v->hasValue = true;

    /* Create server timestamp */
    if(timestamps == UA_TIMESTAMPSTORETURN_SERVER ||
       timestamps == UA_TIMESTAMPSTORETURN_BOTH) {
        v->serverTimestamp = UA_DateTime_now();
        v->hasServerTimestamp = true;
    }

    /* Handle source time stamp */
    if(id->attributeId == UA_ATTRIBUTEID_VALUE) {
        if (timestamps == UA_TIMESTAMPSTORETURN_SERVER ||
            timestamps == UA_TIMESTAMPSTORETURN_NEITHER) {
            v->hasSourceTimestamp = false;
            v->hasSourcePicoseconds = false;
        } else if(!v->hasSourceTimestamp) {
            v->sourceTimestamp = UA_DateTime_now();
            v->hasSourceTimestamp = true;
        }
    }
}